

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O0

void __thiscall libchars::edit_object::swap(edit_object *this)

{
  char cVar1;
  size_t sStack_18;
  char c;
  size_t swap_idx;
  edit_object *this_local;
  
  if (((this->insert_idx != 0) && (this->insert_idx <= this->buflen)) && (1 < this->buflen)) {
    sStack_18 = this->insert_idx;
    if (sStack_18 == this->buflen) {
      sStack_18 = sStack_18 - 1;
    }
    cVar1 = this->buffer[sStack_18];
    this->buffer[sStack_18] = this->buffer[sStack_18 - 1];
    this->buffer[sStack_18 - 1] = cVar1;
    if (this->insert_idx < this->buflen) {
      (*this->_vptr_edit_object[10])(this,1);
    }
  }
  return;
}

Assistant:

virtual void swap()
        {
            if (insert_idx > 0 && insert_idx <= buflen && buflen > 1) {
                size_t swap_idx = insert_idx;
                if (swap_idx == buflen)
                    --swap_idx;
                char c = *(buffer + swap_idx);
                *(buffer + swap_idx) = *(buffer + swap_idx - 1);
                *(buffer + swap_idx - 1) = c;
                if (insert_idx < buflen)
                    right();
            }
        }